

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Vector<float,_2>_>::genFixeds
          (DefaultSampling<tcu::Vector<float,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dst)

{
  ulong uVar1;
  pointer this_00;
  DefaultSampling<float> *pDVar2;
  size_type sVar3;
  reference pvVar4;
  Vector<float,_2> local_58;
  ulong local_50;
  size_t scalarNdx;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> scalars;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dst_local;
  FloatFormat *fmt_local;
  DefaultSampling<tcu::Vector<float,_2>_> *this_local;
  
  scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)dst;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  pDVar2 = instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<float>>();
  (**(code **)*pDVar2)(pDVar2,fmt,(vector<float,_std::allocator<float>_> *)local_38);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_38);
    this_00 = scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (sVar3 <= uVar1) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_38,local_50);
    tcu::Vector<float,_2>::Vector(&local_58,*pvVar4);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)this_00,
               &local_58);
    local_50 = local_50 + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}